

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O3

void __thiscall
cmParseCoberturaCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_0070ce58;
  this->InSources = false;
  this->InSource = false;
  this->SkipThisClass = false;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (cont->SourceDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (cont->SourceDir)._M_string_length);
  plVar2 = local_38;
  pcVar1 = (cont->BinaryDir)._M_dataplus._M_p;
  local_48[0] = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (cont->BinaryDir)._M_string_length);
  __l._M_len = 2;
  __l._M_array = &local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->FilePaths,__l,&local_69);
  lVar3 = -0x40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  this->CTest = ctest;
  this->Coverage = cont;
  (this->CurFileName)._M_dataplus._M_p = (pointer)&(this->CurFileName).field_2;
  (this->CurFileName)._M_string_length = 0;
  (this->CurFileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : FilePaths{ cont.SourceDir, cont.BinaryDir }
    , CTest(ctest)
    , Coverage(cont)
  {
  }